

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O0

float __thiscall
ezc3d::c3d::readFloat
          (c3d *this,PROCESSOR_TYPE processorType,fstream *file,int nByteFromPrevious,seekdir *pos)

{
  char cVar1;
  float *pfVar2;
  reference pvVar3;
  runtime_error *this_00;
  int in_ESI;
  vector<char,_std::allocator<char>_> *in_RDI;
  uint i;
  float out;
  seekdir *in_stack_ffffffffffffffa8;
  value_type vVar4;
  int in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffc4;
  fstream *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffd4;
  float fVar6;
  
  readFile((c3d *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
           in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_RDI,in_stack_ffffffffffffffb4,
           in_stack_ffffffffffffffa8);
  if (in_ESI == 0x54) {
    pfVar2 = (float *)std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)
                                 &in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  field_0x8,0);
    fVar6 = *pfVar2;
  }
  else if (in_ESI == 0x55) {
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
                        ,2);
    vVar4 = *pvVar3;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
                        ,0);
    *pvVar3 = vVar4;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
                        ,3);
    vVar4 = *pvVar3;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
                        ,1);
    *pvVar3 = vVar4;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
                        ,0);
    vVar4 = *pvVar3;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
                        ,2);
    *pvVar3 = vVar4;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
                        ,1);
    if (*pvVar3 == '\0') {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)
                          &in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x8,1);
      vVar4 = *pvVar3;
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)
                          &in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x8,3);
      *pvVar3 = vVar4;
    }
    else {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)
                          &in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x8,1);
      cVar1 = *pvVar3 + -1;
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)
                          &in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x8,3);
      *pvVar3 = cVar1;
    }
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
                        ,4);
    *pvVar3 = '\0';
    pfVar2 = (float *)std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)
                                 &in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  field_0x8,0);
    fVar6 = *pfVar2;
  }
  else {
    if (in_ESI != 0x56) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Wrong type of processor for floating points");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (uVar5 = 0;
        uVar5 < *(uint *)&in_RDI[5].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          field_0x8; uVar5 = uVar5 + 1) {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)
                          &in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x8,
                          (ulong)((*(int *)&in_RDI[5].
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            field_0x8 + -1) - uVar5));
      vVar4 = *pvVar3;
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)
                          &in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x8,(ulong)uVar5);
      *pvVar3 = vVar4;
    }
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
                        ,(ulong)*(uint *)&in_RDI[5].super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.field_0x8);
    *pvVar3 = '\0';
    pfVar2 = (float *)std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)
                                 &in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  field_0x8,0);
    fVar6 = *pfVar2;
  }
  return fVar6;
}

Assistant:

float ezc3d::c3d::readFloat(PROCESSOR_TYPE processorType, std::fstream &file,
                            int nByteFromPrevious,
                            const std::ios_base::seekdir &pos) {
  readFile(file, m_nByteToRead_float, c_float, nByteFromPrevious, pos);
  float out;
  if (processorType == PROCESSOR_TYPE::INTEL) {
    out = *reinterpret_cast<float *>(&c_float[0]);
  } else if (processorType == PROCESSOR_TYPE::DEC) {
    c_float_tp[0] = c_float[2];
    c_float_tp[1] = c_float[3];
    c_float_tp[2] = c_float[0];
    if (c_float[1] != 0)
      c_float_tp[3] = c_float[1] - 1;
    else
      c_float_tp[3] = c_float[1];
    c_float_tp[4] = '\0';
    out = *reinterpret_cast<float *>(&c_float_tp[0]);
  } else if (processorType == PROCESSOR_TYPE::MIPS) {
    for (unsigned int i = 0; i < m_nByteToRead_float; ++i)
      c_float_tp[i] = c_float[m_nByteToRead_float - 1 - i];
    c_float_tp[m_nByteToRead_float] = '\0';
    out = *reinterpret_cast<float *>(&c_float_tp[0]);
  } else {
    throw std::runtime_error("Wrong type of processor for floating points");
  }
  return out;
}